

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_cookie.cpp
# Opt level: O0

void __thiscall cppcms::http::cookie::~cookie(cookie *this)

{
  copy_ptr<cppcms::http::cookie::_data> *in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x11));
  std::__cxx11::string::~string((string *)(in_RDI + 0xd));
  std::__cxx11::string::~string((string *)(in_RDI + 9));
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  booster::copy_ptr<cppcms::http::cookie::_data>::~copy_ptr(in_RDI);
  return;
}

Assistant:

cookie::~cookie() {}